

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O0

void __thiscall binpac::FlowBuffer::set_eof(FlowBuffer *this)

{
  FlowBuffer *this_local;
  
  this->eof_ = true;
  if ((this->chunked_ & 1U) != 0) {
    this->frame_length_ = (int)this->orig_data_end_ - (int)this->orig_data_begin_;
  }
  if (this->frame_length_ < 0) {
    this->frame_length_ = 0;
  }
  return;
}

Assistant:

void FlowBuffer::set_eof()
	{
	// fprintf(stderr, "EOF\n");
	eof_ = true;
	if ( chunked_ )
		frame_length_ = orig_data_end_ - orig_data_begin_;
	if ( frame_length_ < 0 )
		frame_length_ = 0;
	}